

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

natwm_error config_find_string(map *config_map,char *key,char **result)

{
  int *piVar1;
  natwm_error nVar2;
  map_entry *pmVar3;
  
  pmVar3 = map_get(config_map,key);
  nVar2 = NOT_FOUND_ERROR;
  if (((pmVar3 != (map_entry *)0x0) && (piVar1 = (int *)pmVar3->value, piVar1 != (int *)0x0)) &&
     (nVar2 = INVALID_INPUT_ERROR, *piVar1 == 3)) {
    *result = *(char **)(piVar1 + 2);
    nVar2 = NO_ERROR;
  }
  return nVar2;
}

Assistant:

enum natwm_error config_find_string(const struct map *config_map, const char *key,
                                    const char **result)
{
        struct config_value *value = config_find(config_map, key);

        if (value == NULL) {
                return NOT_FOUND_ERROR;
        }

        if (value->type != STRING) {
                return INVALID_INPUT_ERROR;
        }

        *result = value->data.string;

        return NO_ERROR;
}